

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

BOOL Js::JavascriptOperators::IsNumberFromNativeArray
               (Var instance,uint32 index,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  JavascriptCopyOnAccessNativeIntArray *this;
  undefined4 *puVar5;
  RecyclableObject *pRVar6;
  Type TVar7;
  Var local_48;
  Var member;
  uint32 local_34;
  
  local_34 = index;
  if (instance == (Var)0x0) {
LAB_00ab2481:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_00ab26d9;
    *puVar5 = 0;
  }
  else {
    bVar2 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(instance);
    if (bVar2) {
      this = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(instance);
    }
    else {
      this = (JavascriptCopyOnAccessNativeIntArray *)0x0;
    }
    if (this != (JavascriptCopyOnAccessNativeIntArray *)0x0) {
      JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this);
    }
    if (instance == (Var)0x0) goto LAB_00ab2481;
  }
  if (((ulong)instance & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)instance & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00ab26d9;
    *puVar5 = 0;
  }
  TVar7 = TypeIds_FirstNumberType;
  member = scriptContext;
  if ((((ulong)instance & 0xffff000000000000) != 0x1000000000000) &&
     (TVar7 = TypeIds_Number, (ulong)instance >> 0x32 == 0)) {
    pRVar6 = UnsafeVarTo<Js::RecyclableObject>(instance);
    if (pRVar6 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_00ab26d9;
      *puVar5 = 0;
    }
    TVar7 = ((pRVar6->type).ptr)->typeId;
    if ((0x57 < (int)TVar7) && (BVar3 = RecyclableObject::IsExternal(pRVar6), BVar3 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar2) {
LAB_00ab26d9:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
  }
  if ((TVar7 == TypeIds_NativeIntArray) || (TVar7 == TypeIds_ArrayLast)) {
    if (10 < TVar7 - TypeIds_Int8Array) goto LAB_00ab2685;
  }
  else if (10 < TVar7 - TypeIds_Int8Array) {
    return 0;
  }
  BVar3 = TypedArrayBase::IsDetachedTypedArray(instance);
  if (BVar3 != 0) {
    return 0;
  }
LAB_00ab2685:
  pRVar6 = VarTo<Js::RecyclableObject>(instance);
  local_48 = (Var)0x0;
  iVar4 = (*(pRVar6->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x26])(pRVar6,pRVar6,(ulong)local_34,&local_48,member);
  if ((iVar4 == 1) && (BVar3 = IsUndefined(local_48), BVar3 == 0)) {
    return 1;
  }
  return 0;
}

Assistant:

BOOL JavascriptOperators::IsNumberFromNativeArray(Var instance, uint32 index, ScriptContext* scriptContext)
    {
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(instance);
#endif
        Js::TypeId instanceType = JavascriptOperators::GetTypeId(instance);
        // Fast path for native and typed arrays.
        bool isNativeArray = instanceType == TypeIds_NativeIntArray || instanceType == TypeIds_NativeFloatArray;
        bool isTypedArray = instanceType >= TypeIds_Int8Array && instanceType <= TypeIds_Uint64Array;
        if (isNativeArray || isTypedArray)
        {
            // Check if the typed array is detached to prevent an exception in GetOwnItem
            if (isTypedArray && TypedArrayBase::IsDetachedTypedArray(instance))
            {
                return FALSE;
            }
            RecyclableObject* object = VarTo<RecyclableObject>(instance);
            Var member = nullptr;

            // If the item is found in the array own body, then it is a number
            if (JavascriptOperators::GetOwnItem(object, index, &member, scriptContext)
                && !JavascriptOperators::IsUndefined(member))
            {
                return TRUE;
            }
        }
        return FALSE;
    }